

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::iterate(TextureSizeCase *this)

{
  ostringstream *poVar1;
  bool bVar2;
  RGBA c;
  code *pcVar3;
  RenderContext *context;
  int iVar4;
  GLenum GVar5;
  deUint32 dVar6;
  GLenum GVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  RenderTarget *pRVar13;
  char *description;
  qpTestResult testResult;
  pointer pVVar14;
  int iVar15;
  IterateResult local_350;
  Surface result;
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  long lVar12;
  
  local_350 = CONTINUE;
  tcu::Surface::Surface(&result,1,1);
  local_330.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_330.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"\nIteration ");
  std::ostream::operator<<(poVar1,this->m_iteration + 1);
  std::operator<<((ostream *)poVar1," / ");
  std::ostream::operator<<
            (poVar1,(int)(((long)(this->m_iterations).
                                 super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_iterations).
                                super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0xc));
  tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  pVVar14 = (this->m_iterations).
            super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl.
            super__Vector_impl_data._M_start + this->m_iteration;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar4);
  if (this->m_isArrayType == false) {
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Creating texture with size ");
    std::ostream::operator<<(poVar1,pVVar14->m_data[0]);
    std::operator<<((ostream *)poVar1,"x");
    std::ostream::operator<<(poVar1,pVVar14->m_data[1]);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Creating texture with size ");
    std::ostream::operator<<(poVar1,pVVar14->m_data[0]);
    std::operator<<((ostream *)poVar1,"x");
    std::ostream::operator<<(poVar1,pVVar14->m_data[1]);
    std::operator<<((ostream *)poVar1,"x");
    std::ostream::operator<<(poVar1,pVVar14->m_data[2]);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  (**(code **)(lVar12 + 0x6f8))(1,&this->m_texture);
  pcVar3 = *(code **)(lVar12 + 0xb8);
  GVar5 = getTextureGLTarget(this);
  (*pcVar3)(GVar5,this->m_texture);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"texture gen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x195);
  bVar2 = this->m_isArrayType;
  GVar5 = getTextureGLTarget(this);
  iVar4 = this->m_numSamples;
  GVar7 = getTextureGLInternalFormat(this);
  if (bVar2 == false) {
    (**(code **)(lVar12 + 0x1390))(GVar5,iVar4,GVar7,pVVar14->m_data[0],pVVar14->m_data[1],0);
  }
  else {
    (**(code **)(lVar12 + 0x13a8))
              (GVar5,iVar4,GVar7,pVVar14->m_data[0],pVVar14->m_data[1],pVVar14->m_data[2],0);
  }
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"texStorage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x19b);
  iVar4 = this->m_iteration;
  pVVar14 = (this->m_iterations).
            super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var_00,iVar8);
  uVar9 = (**(code **)(lVar12 + 0x780))((this->m_shader->m_program).m_program,"a_position");
  uVar10 = (**(code **)(lVar12 + 0xb48))((this->m_shader->m_program).m_program,"u_sampler");
  uVar11 = (**(code **)(lVar12 + 0xb48))((this->m_shader->m_program).m_program,"u_size");
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Running the verification shader.");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"preclear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1b4);
  (**(code **)(lVar12 + 0x1a00))(0,0,1);
  (**(code **)(lVar12 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar12 + 0x188))(0x4000);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1b8);
  (**(code **)(lVar12 + 0x40))(0x8892,this->m_vbo);
  (**(code **)(lVar12 + 0x19f0))(uVar9,4,0x1406,0,0,0);
  (**(code **)(lVar12 + 0x610))(uVar9);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"vertexAttrib",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1bd);
  (**(code **)(lVar12 + 0x1680))((this->m_shader->m_program).m_program);
  (**(code **)(lVar12 + 0x14f0))(uVar10,0);
  (**(code **)(lVar12 + 0x1538 + (ulong)this->m_isArrayType * 0x40))(uVar11,1,pVVar14 + iVar4);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1c5);
  pcVar3 = *(code **)(lVar12 + 0xb8);
  GVar5 = getTextureGLTarget(this);
  (*pcVar3)(GVar5,this->m_texture);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"bindtex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1c8);
  (**(code **)(lVar12 + 0x538))(5,0,4);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1cb);
  (**(code **)(lVar12 + 0x518))(uVar9);
  (**(code **)(lVar12 + 0x1680))(0);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"cleanup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1cf);
  (**(code **)(lVar12 + 0x648))();
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&result);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&local_1b0);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                  ,0x1d3);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_texture != 0) {
    (**(code **)(CONCAT44(extraout_var_01,iVar4) + 0x480))(1,&this->m_texture);
    this->m_texture = 0;
    dVar6 = (**(code **)(CONCAT44(extraout_var_01,iVar4) + 0x800))();
    glu::checkError(dVar6,"texture delete",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderTextureSizeTests.cpp"
                    ,0x1a7);
  }
  this->m_allCasesSkipped = false;
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar15 = 1 << (8U - (char)(pRVar13->m_pixelFormat).redBits & 0x1f);
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = 1 << (8U - (char)(pRVar13->m_pixelFormat).greenBits & 0x1f);
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = 1 << (8U - (char)(pRVar13->m_pixelFormat).blueBits & 0x1f);
  c.m_value = *result.m_pixels.m_ptr;
  local_330.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_330.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Verifying image.");
  tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if ((((int)(c.m_value & 0xff) < iVar15) && (0xff - iVar8 < (int)(c.m_value >> 8 & 0xff))) &&
     ((int)(c.m_value >> 0x10 & 0xff) < iVar4)) {
    local_330.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_330.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Result ok.");
    tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  else {
    if (((0xff - iVar15 < (int)(c.m_value & 0xff)) && ((int)(c.m_value >> 8 & 0xff) < iVar8)) &&
       ((int)(c.m_value >> 0x10 & 0xff) < iVar4)) {
      local_330.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330.m_str);
      std::operator<<((ostream *)&local_330.m_str,"Image size incorrect.");
      tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_330.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_330.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Expected either green or red pixel, got ");
      tcu::operator<<((ostream *)poVar1,c);
      tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330.m_str);
    this->m_allIterationsPassed = false;
  }
  iVar4 = this->m_iteration + 1;
  this->m_iteration = iVar4;
  if (iVar4 < (int)(((long)(this->m_iterations).
                           super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_iterations).
                          super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc)) goto LAB_00489928;
  if (this->m_allIterationsPassed == false) {
    local_330.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_330.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"One or more test sizes failed.");
    tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    description = "Got invalid texture size";
LAB_004898c8:
    testResult = QP_TEST_RESULT_FAIL;
  }
  else {
    if (this->m_allCasesSkipped == true) {
      local_330.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_330.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Could not test any texture size, texture creation failed.")
      ;
      tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      description = "All test texture creations failed";
      goto LAB_004898c8;
    }
    local_330.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_330.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"All texture sizes passed.");
    tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  local_350 = STOP;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
LAB_00489928:
  tcu::Surface::~Surface(&result);
  return local_350;
}

Assistant:

TextureSizeCase::IterateResult TextureSizeCase::iterate (void)
{
	tcu::Surface	result		(1, 1);
	bool			skipTest	= false;

	m_testCtx.getLog() << tcu::TestLog::Message << "\nIteration " << (m_iteration+1) << " / " << (int)m_iterations.size() << tcu::TestLog::EndMessage;

	try
	{
		// set texture size

		createTexture(m_iterations[m_iteration]);

		// query texture size

		runShader(result, m_iterations[m_iteration]);
	}
	catch (glu::OutOfMemoryError&)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Got GL_OUT_OF_MEMORY, skipping this size" << tcu::TestLog::EndMessage;

		skipTest = true;
	}

	// free resources

	deleteTexture();

	// queried value was correct?

	if (!skipTest)
	{
		m_allCasesSkipped = false;

		if (!verifyImage(result))
			m_allIterationsPassed = false;
	}

	// final result

	if (++m_iteration < (int)m_iterations.size())
		return CONTINUE;

	if (!m_allIterationsPassed)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "One or more test sizes failed." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid texture size");
	}
	else if (m_allCasesSkipped)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Could not test any texture size, texture creation failed." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "All test texture creations failed");
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "All texture sizes passed." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}